

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOCallback.cpp
# Opt level: O0

void __thiscall libebml::IOCallback::readFully(IOCallback *this,void *Buffer,size_t Size)

{
  uint uVar1;
  ostream *poVar2;
  runtime_error *this_00;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream Msg;
  ostream local_198 [376];
  ulong local_20;
  size_t Size_local;
  void *Buffer_local;
  IOCallback *this_local;
  
  local_20 = Size;
  Size_local = (size_t)Buffer;
  Buffer_local = this;
  if (Buffer == (void *)0x0) {
    __cxa_rethrow();
  }
  uVar1 = (*this->_vptr_IOCallback[2])(this,Size_local,local_20);
  if (uVar1 != local_20) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    poVar2 = std::operator<<(local_198,"EOF in readFully(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(void *)Size_local);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    std::operator<<(poVar2,")");
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this_00,local_1d8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void IOCallback::readFully(void*Buffer,size_t Size)
{
  if(Buffer == NULL)
    throw;

  if(read(Buffer,Size) != Size) {
#if !defined(__GNUC__) || (__GNUC__ > 2)
    stringstream Msg;
    Msg<<"EOF in readFully("<<Buffer<<","<<Size<<")";
    throw runtime_error(Msg.str());
#endif // GCC2
  }
}